

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void icetStateDump(void)

{
  IceTState local_18;
  IceTState state;
  IceTEnum pname;
  
  local_18 = icetGetState();
  printf("State dump:\n");
  for (state._4_4_ = 0; state._4_4_ < 0x200; state._4_4_ = state._4_4_ + 1) {
    if (local_18->type != 0) {
      printf("param       = 0x%x\n",(ulong)state._4_4_);
      printf("type        = 0x%x\n",(ulong)local_18->type);
      printf("num_entries = %d\n",(ulong)(uint)local_18->num_entries);
      printf("data        = %p\n",local_18->data);
      printf("mod         = %d\n",local_18->mod_time & 0xffffffff);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void icetStateDump(void)
{
    IceTEnum pname;
    IceTState state;

    state = icetGetState();
    printf("State dump:\n");
    for (pname = ICET_STATE_ENGINE_START;
         pname < ICET_STATE_ENGINE_END;
         pname++) {
        stateCheck(pname, state);
        if (state->type != ICET_NULL) {
            printf("param       = 0x%x\n", pname);
            printf("type        = 0x%x\n", (int)state->type);
            printf("num_entries = %d\n", (int)state->num_entries);
            printf("data        = %p\n", state->data);
            printf("mod         = %d\n", (int)state->mod_time);
        }
        state++;
    }
}